

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O0

int s3phseg_read(char *fn,acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  s3phseg_s *psVar1;
  int iVar2;
  acmod_id_t id;
  uint32 uVar3;
  FILE *__stream;
  size_t sVar4;
  char *pcVar5;
  s3phseg_t *psVar6;
  s3phseg_s *local_280;
  s3phseg_t *last;
  s3phseg_t *next;
  char *cc;
  char *c;
  s3phseg_t *phseg;
  acmod_id_t phone;
  acmod_id_t ci;
  int score;
  uint ef;
  uint sf;
  int n;
  s3phseg_t *plist;
  char txt [512];
  FILE *fp;
  s3phseg_t **out_phseg_local;
  acmod_set_t *acmod_set_local;
  char *fn_local;
  
  _sf = (s3phseg_t *)0x0;
  __stream = fopen(fn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
            ,0x40,"Failed to open phseg file %s\n",fn);
    return -1;
  }
  do {
    ef = __isoc99_fscanf(__stream,"%511s",&plist);
    if (ef == 0) break;
    if (ef == 0xffffffff) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
              ,0x46,"Failed to read column headers from phseg file\n");
      goto LAB_0014573e;
    }
    iVar2 = strcmp((char *)&plist,"Phone");
  } while (iVar2 != 0);
  while( true ) {
    iVar2 = feof(__stream);
    if ((iVar2 != 0) || (ef = __isoc99_fscanf(__stream,"%u %u %d",&score,&ci,&phone), (int)ef < 3))
    {
      fclose(__stream);
      if (out_phseg == (s3phseg_t **)0x0) {
        s3phseg_free(_sf);
      }
      else {
        local_280 = (s3phseg_s *)0x0;
        while (_sf != (s3phseg_t *)0x0) {
          psVar1 = _sf->next;
          *out_phseg = _sf;
          (*out_phseg)->next = local_280;
          local_280 = *out_phseg;
          _sf = psVar1;
        }
      }
      return 0;
    }
    fgets((char *)&plist,0x200,__stream);
    sVar4 = strlen((char *)&plist);
    if (*(char *)((long)&n + sVar4 + 3) == '\n') {
      sVar4 = strlen((char *)&plist);
      *(undefined1 *)((long)&n + sVar4 + 3) = 0;
    }
    sVar4 = strspn((char *)&plist," \t");
    pcVar5 = strchr(txt + (sVar4 - 8),0x20);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
    }
    id = acmod_set_name2id(acmod_set,(char *)&plist);
    if (id == 0xffffffff) break;
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = ' ';
    }
    phseg._0_4_ = id;
    if (((acmod_set->n_multi != 0) &&
        (uVar3 = acmod_set_has_attrib(acmod_set,id,"filler"), uVar3 == 0)) &&
       (phseg._0_4_ = acmod_set_name2id(acmod_set,(char *)&plist), (acmod_id_t)phseg == 0xffffffff))
    {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
              ,0x69,"Unknown triphone (%s) in phseg file\n",&plist);
      phseg._0_4_ = id;
    }
    psVar6 = (s3phseg_t *)
             __ckd_calloc__(1,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
                            ,0x6e);
    psVar6->next = _sf;
    psVar6->phone = (acmod_id_t)phseg;
    psVar6->sf = score;
    psVar6->ef = ci;
    psVar6->score = phone;
    _sf = psVar6;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3phseg_io.c"
          ,0x60,"Unknown CI phone (%s) in phseg file\n",&plist);
LAB_0014573e:
  fclose(__stream);
  return -1;
}

Assistant:

int
s3phseg_read(const char *fn,
	     acmod_set_t *acmod_set,
	     s3phseg_t **out_phseg)
{
	FILE *fp;
	char txt[512];
	s3phseg_t *plist = NULL;
	int n;

	if ((fp = fopen(fn, "r")) == NULL) {
		E_ERROR("Failed to open phseg file %s\n", fn);
		return S3_ERROR;
	}
	/* Should be a header of column names */
	while ((n = fscanf(fp, "%511s", txt))) {
		if (n == EOF) {
			E_ERROR("Failed to read column headers from phseg file\n");
			goto error_out;
		}
		if (!strcmp(txt, "Phone"))
			break;
	}
	/* Get each line */
	while (!feof(fp)) {
		unsigned int sf, ef;
		int score;
		acmod_id_t ci, phone;
		s3phseg_t *phseg;
		char *c, *cc;

		n = fscanf(fp, "%u %u %d", &sf, &ef, &score);
		if (n < 3) /* We probably hit EOF or "Total score" */
			break;
		fgets(txt, sizeof(txt), fp);
		/* Remove newline. */
		if (txt[strlen(txt)-1] == '\n')
			txt[strlen(txt)-1] = '\0';
		/* Find the base phone. */
		cc = txt + strspn(txt, " \t");
		if ((c = strchr(cc, ' ')))
			*c = '\0';
		if ((ci = phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
			E_ERROR("Unknown CI phone (%s) in phseg file\n", txt);
			goto error_out;
		}
		/* Restore the space and find the triphone if necessary. */
		if (c) *c = ' ';
		if (acmod_set->n_multi != 0
		    && !acmod_set_has_attrib(acmod_set, phone, "filler")) {
			if ((phone = acmod_set_name2id(acmod_set, txt)) == NO_ACMOD) {
				/* This might be too verbose. */
				E_WARN("Unknown triphone (%s) in phseg file\n", txt);
				/* Back off to CI phone. */
				phone = ci;
			}
		}
		phseg = ckd_calloc(1, sizeof(*phseg));
		phseg->next = plist;
		phseg->phone = phone;
		phseg->sf = sf;
		phseg->ef = ef;
		phseg->score = score;
		plist = phseg;
	}
	fclose(fp);
	if (out_phseg) {
		s3phseg_t *next, *last = NULL;
		/* Now reverse the list. */
		while (plist) {
			next = plist->next;
			*out_phseg = plist;
			(*out_phseg)->next = last;
			last = *out_phseg;
			plist = next;
		}
	}
	else
		s3phseg_free(plist);
	return S3_SUCCESS;
error_out:
	fclose(fp);
	return S3_ERROR;
}